

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-socket-buffer-size.c
# Opt level: O2

int run_test_socket_buffer_size(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uStack_20;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&tcp);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&tcp,&addr,0);
      if (iVar1 == 0) {
        check_buffer_size((uv_handle_t *)&tcp);
        uv_close(&tcp,close_cb);
        uVar2 = uv_default_loop();
        iVar1 = uv_udp_init(uVar2,&udp);
        if (iVar1 == 0) {
          iVar1 = uv_udp_bind(&udp,&addr,0);
          if (iVar1 == 0) {
            check_buffer_size((uv_handle_t *)&udp);
            uv_close(&udp,close_cb);
            uVar2 = uv_default_loop();
            iVar1 = uv_run(uVar2,0);
            if (iVar1 == 0) {
              if (close_cb_called == 2) {
                uVar2 = uv_default_loop();
                uv_walk(uVar2,close_walk_cb,0);
                uv_run(uVar2,0);
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                uStack_20 = 0x4b;
              }
              else {
                pcVar3 = "close_cb_called == 2";
                uStack_20 = 0x49;
              }
            }
            else {
              pcVar3 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
              uStack_20 = 0x47;
            }
          }
          else {
            pcVar3 = "0 == uv_udp_bind(&udp, (struct sockaddr*) &addr, 0)";
            uStack_20 = 0x43;
          }
        }
        else {
          pcVar3 = "0 == uv_udp_init(uv_default_loop(), &udp)";
          uStack_20 = 0x42;
        }
      }
      else {
        pcVar3 = "0 == uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0)";
        uStack_20 = 0x3e;
      }
    }
    else {
      pcVar3 = "0 == uv_tcp_init(uv_default_loop(), &tcp)";
      uStack_20 = 0x3d;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uStack_20 = 0x3b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-socket-buffer-size.c"
          ,uStack_20,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(socket_buffer_size) {
  struct sockaddr_in addr;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &tcp));
  ASSERT(0 == uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &tcp);
  uv_close((uv_handle_t*) &tcp, close_cb);

  ASSERT(0 == uv_udp_init(uv_default_loop(), &udp));
  ASSERT(0 == uv_udp_bind(&udp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &udp);
  uv_close((uv_handle_t*) &udp, close_cb);

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}